

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O0

lu_mem checkgraylist(global_State *g,GCObject *o)

{
  int local_1c;
  GCObject *pGStack_18;
  int total;
  GCObject *o_local;
  global_State *g_local;
  
  local_1c = 0;
  pGStack_18 = o;
  while( true ) {
    if (pGStack_18 == (GCObject *)0x0) {
      return (long)local_1c;
    }
    if (((pGStack_18->marked & 0x38) == 0) == ((pGStack_18->marked & 7) == 6)) break;
    if ((pGStack_18->marked & 0x80) != 0) {
      __assert_fail("!((o->marked) & ((1<<(7))))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                    ,0x1b4,"lu_mem checkgraylist(global_State *, GCObject *)");
    }
    if (g->gcstate < 3) {
      pGStack_18->marked = pGStack_18->marked | 0x80;
    }
    local_1c = local_1c + 1;
    switch(pGStack_18->tt) {
    case '\x05':
      if (pGStack_18->tt != '\x05') {
        __assert_fail("(o)->tt == 5",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                      ,0x1b9,"lu_mem checkgraylist(global_State *, GCObject *)");
      }
      pGStack_18 = pGStack_18[3].next;
      break;
    case '\x06':
      if (pGStack_18->tt != '\x06') {
        __assert_fail("(o)->tt == ((6) | ((0) << 4))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                      ,0x1ba,"lu_mem checkgraylist(global_State *, GCObject *)");
      }
      pGStack_18 = pGStack_18[1].next;
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                    ,0x1be,"lu_mem checkgraylist(global_State *, GCObject *)");
    case '\b':
      if (pGStack_18->tt != '\b') {
        __assert_fail("(o)->tt == 8",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                      ,0x1bc,"lu_mem checkgraylist(global_State *, GCObject *)");
      }
      pGStack_18 = *(GCObject **)&pGStack_18[4].tt;
      break;
    case '\t':
      if (pGStack_18->tt != '\t') {
        __assert_fail("(o)->tt == 9",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                      ,0x1bd,"lu_mem checkgraylist(global_State *, GCObject *)");
      }
      pGStack_18 = pGStack_18[7].next;
      break;
    case '&':
      if (pGStack_18->tt != '&') {
        __assert_fail("(o)->tt == ((6) | ((2) << 4))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                      ,0x1bb,"lu_mem checkgraylist(global_State *, GCObject *)");
      }
      pGStack_18 = pGStack_18[1].next;
    }
  }
  __assert_fail("!!(!(((o)->marked) & (((1<<(3)) | (1<<(4))) | (1<<(5))))) ^ (((o)->marked & 7) == 6)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                ,0x1b3,"lu_mem checkgraylist(global_State *, GCObject *)");
}

Assistant:

static lu_mem checkgraylist (global_State *g, GCObject *o) {
  int total = 0;  /* count number of elements in the list */
  ((void)g);  /* better to keep it available if we need to print an object */
  while (o) {
    lua_assert(!!isgray(o) ^ (getage(o) == G_TOUCHED2));
    lua_assert(!testbit(o->marked, TESTBIT));
    if (keepinvariant(g))
      l_setbit(o->marked, TESTBIT);  /* mark that object is in a gray list */
    total++;
    switch (o->tt) {
      case LUA_TTABLE: o = gco2t(o)->gclist; break;
      case LUA_TLCL: o = gco2lcl(o)->gclist; break;
      case LUA_TCCL: o = gco2ccl(o)->gclist; break;
      case LUA_TTHREAD: o = gco2th(o)->gclist; break;
      case LUA_TPROTO: o = gco2p(o)->gclist; break;
      default: lua_assert(0);  /* other objects cannot be gray */
    }
  }
  return total;
}